

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommandlinkbutton.cpp
# Opt level: O0

bool __thiscall QCommandLinkButton::event(QCommandLinkButton *this,QEvent *e)

{
  bool bVar1;
  Type TVar2;
  QStyle *pQVar3;
  QEvent *in_RSI;
  QEvent *in_RDI;
  long in_FS_OFFSET;
  QStyleOptionButton opt;
  QWidget *in_stack_ffffffffffffff58;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  QIcon local_80;
  undefined1 local_78 [112];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  TVar2 = QEvent::type(in_RSI);
  if (TVar2 == StyleChange) {
    memset(local_78,0xaa,0x70);
    QStyleOptionButton::QStyleOptionButton((QStyleOptionButton *)0x55617d);
    (**(code **)(*(QIconPrivate **)in_RDI + 0x1b8))(in_RDI,local_78);
    pQVar3 = QWidget::style(in_stack_ffffffffffffff58);
    (**(code **)(*(long *)pQVar3 + 0x100))(&local_80,pQVar3,0x39,local_78,in_RDI);
    QAbstractButton::setIcon((QAbstractButton *)in_RSI,(QIcon *)in_RDI);
    QIcon::~QIcon(&local_80);
    QStyleOptionButton::~QStyleOptionButton
              ((QStyleOptionButton *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
  }
  bVar1 = QPushButton::event((QPushButton *)in_RSI,in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QCommandLinkButton::event(QEvent *e)
{
    if (e->type() == QEvent::StyleChange) {
        QStyleOptionButton opt;
        initStyleOption(&opt);
        setIcon(style()->standardIcon(QStyle::SP_CommandLink, &opt, this));
    }

    return QPushButton::event(e);
}